

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchronized_timer.cpp
# Opt level: O3

void __thiscall
jessilib::synchonrized_callback::operator()(synchonrized_callback *this,timer *in_timer)

{
  atomic<unsigned_int> *paVar1;
  __int_type_conflict1 _Var2;
  bool bVar3;
  undefined8 uVar4;
  cancel_detector detector;
  cancel_detector cStack_28;
  
  cancel_detector::cancel_detector(&cStack_28,&this->m_cancel_token);
  LOCK();
  paVar1 = &this->m_calls;
  _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (_Var2 == 0) {
    paVar1 = &this->m_calls;
    do {
      if ((this->m_callback).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar4 = std::__throw_bad_function_call();
        cancel_detector::~cancel_detector(&cStack_28);
        _Unwind_Resume(uVar4);
      }
      (*(this->m_callback)._M_invoker)((_Any_data *)this,in_timer);
      bVar3 = cancel_detector::expired(&cStack_28);
      if (bVar3) break;
      LOCK();
      (paVar1->super___atomic_base<unsigned_int>)._M_i =
           (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
      UNLOCK();
    } while ((paVar1->super___atomic_base<unsigned_int>)._M_i != 0);
  }
  cancel_detector::~cancel_detector(&cStack_28);
  return;
}

Assistant:

void operator()(timer& in_timer) {
		cancel_detector detector = m_cancel_token;
		// Iterate calls
		if (++m_calls == 1) {
			// No other calls were queued; this should be safe.
			do {
				m_callback(in_timer);

				// callback may have cancelled the timer (and thus destructed this callback); check
				if (detector.expired()) {
					// We cannot access any members of this struct outside of the stack; return immediately
					return;
				}
			}
			while (--m_calls != 0);
		}
	}